

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_20::FieldValuePrinterWrapper::PrintMessageEnd
          (FieldValuePrinterWrapper *this,Message *message,int field_index,int field_count,
          bool single_line_mode,BaseTextGenerator *generator)

{
  FieldValuePrinter *pFVar1;
  undefined7 in_register_00000081;
  undefined8 local_38;
  undefined8 local_30;
  
  pFVar1 = (this->delegate_)._M_t.
           super___uniq_ptr_impl<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           .super__Head_base<0UL,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_false>.
           _M_head_impl;
  (*pFVar1->_vptr_FieldValuePrinter[0xe])
            (&local_38,pFVar1,message,field_index,(ulong)(uint)field_count,
             CONCAT71(in_register_00000081,single_line_mode) & 0xffffffff);
  (*generator->_vptr_BaseTextGenerator[5])(generator,local_38,local_30);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void PrintMessageEnd(
      const Message& message, int field_index, int field_count,
      bool single_line_mode,
      TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(delegate_->PrintMessageEnd(
        message, field_index, field_count, single_line_mode));
  }